

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O0

void __thiscall
duckdb::RLECompressState<unsigned_short,_true>::CreateEmptySegment
          (RLECompressState<unsigned_short,_true> *this,idx_t row_start)

{
  BlockManager *other;
  BufferHandle *this_00;
  pointer pCVar1;
  long in_RDI;
  idx_t in_stack_00000048;
  idx_t in_stack_00000050;
  LogicalType *in_stack_00000058;
  CompressionFunction *in_stack_00000060;
  DatabaseInstance *in_stack_00000068;
  BlockManager *in_stack_00000080;
  BufferManager *buffer_manager;
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> column_segment
  ;
  LogicalType *type;
  DatabaseInstance *db;
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
  *in_stack_ffffffffffffff50;
  undefined1 local_58 [40];
  BufferHandle *local_30;
  LogicalType *local_20;
  DatabaseInstance *local_18;
  
  local_18 = ColumnDataCheckpointData::GetDatabase((ColumnDataCheckpointData *)0xa5d28d);
  local_20 = ColumnDataCheckpointData::GetType((ColumnDataCheckpointData *)0xa5d2a6);
  CompressionInfo::GetBlockSize((CompressionInfo *)0xa5d2f1);
  other = CompressionInfo::GetBlockManager((CompressionInfo *)(in_RDI + 8));
  ColumnSegment::CreateTransientSegment
            (in_stack_00000068,in_stack_00000060,in_stack_00000058,in_stack_00000050,
             in_stack_00000048,in_stack_00000080);
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::operator=
            (in_stack_ffffffffffffff50,
             (unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *)
             other);
  this_00 = (BufferHandle *)BufferManager::GetBufferManager((DatabaseInstance *)0xa5d354);
  local_30 = this_00;
  pCVar1 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                       *)this_00);
  (**(code **)((long)&(((this_00->handle).internal.
                        super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->lock).super___mutex_base._M_mutex + 0x20))(local_58,this_00,&pCVar1->block);
  BufferHandle::operator=(this_00,(BufferHandle *)other);
  BufferHandle::~BufferHandle(this_00);
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::~unique_ptr
            ((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *)
             0xa5d3d5);
  return;
}

Assistant:

void CreateEmptySegment(idx_t row_start) {
		auto &db = checkpoint_data.GetDatabase();
		auto &type = checkpoint_data.GetType();

		auto column_segment = ColumnSegment::CreateTransientSegment(db, function, type, row_start, info.GetBlockSize(),
		                                                            info.GetBlockManager());
		current_segment = std::move(column_segment);

		auto &buffer_manager = BufferManager::GetBufferManager(db);
		handle = buffer_manager.Pin(current_segment->block);
	}